

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_gather.cpp
# Opt level: O2

void duckdb::HeapGatherListVector
               (Vector *v,idx_t vcount,SelectionVector *sel,data_ptr_t *key_locations)

{
  bool bVar1;
  LogicalType *other;
  list_entry_t *plVar2;
  uint64_t uVar3;
  Vector *vector;
  SelectionVector *sel_00;
  data_ptr_t pdVar4;
  long lVar5;
  idx_t iVar6;
  idx_t iVar7;
  uint64_t *puVar8;
  idx_t iVar9;
  idx_t entry_idx;
  idx_t iVar10;
  uint64_t uVar11;
  long lVar12;
  unsigned_long next;
  LogicalType child_type;
  Vector append_vector;
  data_ptr_t list_entry_locations [2048];
  data_ptr_t local_4130;
  idx_t local_40d8;
  LogicalType local_40d0;
  LogicalType local_40b8;
  Vector local_40a0;
  data_ptr_t local_4038 [2049];
  
  FlatVector::VerifyFlatVector(v);
  other = ListType::GetChildType(&v->type);
  LogicalType::LogicalType(&local_40d0,other);
  plVar2 = ListVector::GetData(v);
  uVar3 = ListVector::GetListSize(v);
  for (iVar6 = 0; iVar6 != vcount; iVar6 = iVar6 + 1) {
    iVar9 = iVar6;
    if (sel->sel_vector != (sel_t *)0x0) {
      iVar9 = (idx_t)sel->sel_vector[iVar6];
    }
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(v->validity).super_TemplatedValidityMask<unsigned_long>,iVar9);
    if (bVar1) {
      puVar8 = (uint64_t *)key_locations[iVar6];
      uVar11 = *puVar8;
      plVar2[iVar9].length = uVar11;
      plVar2[iVar9].offset = uVar3;
      key_locations[iVar6] = (data_ptr_t)((long)puVar8 + (uVar11 + 7 >> 3) + 8);
      bVar1 = TypeIsConstantSize(local_40d0.physical_type_);
      if (bVar1) {
        local_4130 = (data_ptr_t)0x0;
      }
      else {
        local_4130 = key_locations[iVar6];
        key_locations[iVar6] = local_4130 + uVar11 * 8;
      }
      puVar8 = puVar8 + 1;
      lVar12 = 0;
      for (; uVar11 != 0; uVar11 = uVar11 - iVar9) {
        iVar9 = 0x800;
        if (uVar11 < 0x800) {
          iVar9 = uVar11;
        }
        local_40d8 = iVar9;
        LogicalType::LogicalType(&local_40b8,&v->type);
        Vector::Vector(&local_40a0,&local_40b8,0x800);
        LogicalType::~LogicalType(&local_40b8);
        Vector::SetVectorType(&local_40a0,v->vector_type);
        vector = ListVector::GetEntry(&local_40a0);
        FlatVector::VerifyFlatVector(vector);
        for (iVar10 = 0; iVar9 != iVar10; iVar10 = iVar10 + 1) {
          TemplatedValidityMask<unsigned_long>::Set
                    (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar10,
                     ((byte)*puVar8 >> ((uint)lVar12 & 0x1f) & 1) != 0);
          lVar12 = lVar12 + 1;
          bVar1 = lVar12 == 8;
          if (bVar1) {
            lVar12 = 0;
          }
          puVar8 = (uint64_t *)((long)puVar8 + (ulong)bVar1);
        }
        bVar1 = TypeIsConstantSize(local_40d0.physical_type_);
        if (bVar1) {
          iVar10 = GetTypeIdSize(local_40d0.physical_type_);
          pdVar4 = key_locations[iVar6];
          for (iVar7 = 0; iVar9 != iVar7; iVar7 = iVar7 + 1) {
            local_4038[iVar7] = pdVar4;
            pdVar4 = pdVar4 + iVar10;
          }
          key_locations[iVar6] = pdVar4;
        }
        else {
          pdVar4 = key_locations[iVar6];
          for (lVar5 = 0; iVar9 * 8 - lVar5 != 0; lVar5 = lVar5 + 8) {
            *(data_ptr_t *)((long)local_4038 + lVar5) = pdVar4;
            pdVar4 = pdVar4 + *(long *)(local_4130 + lVar5);
            key_locations[iVar6] = pdVar4;
          }
          local_4130 = local_4130 + lVar5;
        }
        sel_00 = FlatVector::IncrementalSelectionVector();
        RowOperations::HeapGather
                  (vector,&local_40d8,sel_00,local_4038,
                   (optional_ptr<duckdb::NestedValidity,_true>)0x0);
        ListVector::Append(v,vector,iVar9,0);
        uVar3 = uVar3 + iVar9;
        Vector::~Vector(&local_40a0);
      }
    }
  }
  LogicalType::~LogicalType(&local_40d0);
  return;
}

Assistant:

static void HeapGatherListVector(Vector &v, const idx_t vcount, const SelectionVector &sel, data_ptr_t *key_locations) {
	const auto &validity = FlatVector::Validity(v);

	auto child_type = ListType::GetChildType(v.GetType());
	auto list_data = ListVector::GetData(v);
	data_ptr_t list_entry_locations[STANDARD_VECTOR_SIZE];

	uint64_t entry_offset = ListVector::GetListSize(v);
	for (idx_t i = 0; i < vcount; i++) {
		const auto col_idx = sel.get_index(i);
		if (!validity.RowIsValid(col_idx)) {
			continue;
		}
		// read list length
		auto entry_remaining = Load<uint64_t>(key_locations[i]);
		key_locations[i] += sizeof(uint64_t);
		// set list entry attributes
		list_data[col_idx].length = entry_remaining;
		list_data[col_idx].offset = entry_offset;
		// skip over the validity mask
		data_ptr_t validitymask_location = key_locations[i];
		idx_t offset_in_byte = 0;
		key_locations[i] += (entry_remaining + 7) / 8;
		// entry sizes
		data_ptr_t var_entry_size_ptr = nullptr;
		if (!TypeIsConstantSize(child_type.InternalType())) {
			var_entry_size_ptr = key_locations[i];
			key_locations[i] += entry_remaining * sizeof(idx_t);
		}

		// now read the list data
		while (entry_remaining > 0) {
			auto next = MinValue(entry_remaining, (idx_t)STANDARD_VECTOR_SIZE);

			// initialize a new vector to append
			Vector append_vector(v.GetType());
			append_vector.SetVectorType(v.GetVectorType());

			auto &list_vec_to_append = ListVector::GetEntry(append_vector);

			// set validity
			//! Since we are constructing the vector, this will always be a flat vector.
			auto &append_validity = FlatVector::Validity(list_vec_to_append);
			for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
				append_validity.Set(entry_idx, *(validitymask_location) & (1 << offset_in_byte));
				if (++offset_in_byte == 8) {
					validitymask_location++;
					offset_in_byte = 0;
				}
			}

			// compute entry sizes and set locations where the list entries are
			if (TypeIsConstantSize(child_type.InternalType())) {
				// constant size list entries
				const idx_t type_size = GetTypeIdSize(child_type.InternalType());
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += type_size;
				}
			} else {
				// variable size list entries
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += Load<idx_t>(var_entry_size_ptr);
					var_entry_size_ptr += sizeof(idx_t);
				}
			}

			// now deserialize and add to listvector
			RowOperations::HeapGather(list_vec_to_append, next, *FlatVector::IncrementalSelectionVector(),
			                          list_entry_locations, nullptr);
			ListVector::Append(v, list_vec_to_append, next);

			// update for next iteration
			entry_remaining -= next;
			entry_offset += next;
		}
	}
}